

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

void __thiscall irr::core::string<char>::string<char>(string<char> *this,char *c,s32 lenght)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  
  this->array = (char *)0x0;
  this->allocated = 0;
  this->used = 0;
  if (c != (char *)0x0) {
    iVar1 = lenght + 1;
    this->used = iVar1;
    this->allocated = iVar1;
    iVar3 = -1;
    if (-2 < lenght) {
      iVar3 = iVar1;
    }
    pcVar2 = (char *)operator_new__((long)iVar3);
    this->array = pcVar2;
    if (0 < lenght) {
      uVar4 = 0;
      do {
        this->array[uVar4] = c[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)lenght != uVar4);
    }
    this->array[lenght] = '\0';
  }
  return;
}

Assistant:

string(const B* c, s32 lenght)
	: array(0), allocated(0), used(0)
	{
		if (!c)
			return;

        allocated = used = lenght+1;
		array = new T[used];

		for (s32 l = 0; l<lenght; ++l)
			array[l] = (T)c[l];

		array[lenght] = 0;
	}